

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_on_write.h
# Opt level: O0

void __thiscall
copy_on_write<BaseType>::
copy_on_write<DerivedType,default_copy<DerivedType>,default_delete<DerivedType>,void>
          (copy_on_write<BaseType> *this,BaseType *u)

{
  BaseType *pBVar1;
  bool bVar2;
  unique_ptr<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
  local_38 [3];
  BaseType *local_20;
  DerivedType *u_local;
  copy_on_write<BaseType> *this_local;
  
  this->ptr_ = (BaseType *)0x0;
  local_20 = u;
  u_local = (DerivedType *)this;
  std::shared_ptr<shared_control_block<BaseType>_>::shared_ptr(&this->cb_);
  pBVar1 = local_20;
  if (local_20 != (BaseType *)0x0) {
    if (local_20 == (BaseType *)0x0) {
      __cxa_bad_typeid();
    }
    bVar2 = std::type_info::operator==
                      ((type_info *)pBVar1->_vptr_BaseType[-1],(type_info *)&DerivedType::typeinfo);
    if (!bVar2) {
      __assert_fail("typeid(*u) == typeid(U)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jbcoe[P]copy_on_write/copy_on_write.h"
                    ,0xa6,
                    "copy_on_write<BaseType>::copy_on_write(U *, C, D) [T = BaseType, U = DerivedType, C = default_copy<DerivedType>, D = default_delete<DerivedType>, V = void]"
                   );
    }
    std::
    make_unique<indirect_shared_control_block<BaseType,DerivedType,default_copy<DerivedType>,default_delete<DerivedType>>,DerivedType*&,default_copy<DerivedType>,default_delete<DerivedType>>
              ((DerivedType **)local_38,(default_copy<DerivedType> *)&local_20,
               (default_delete<DerivedType> *)((long)&this_local + 7));
    std::shared_ptr<shared_control_block<BaseType>>::operator=
              ((shared_ptr<shared_control_block<BaseType>> *)&this->cb_,local_38);
    std::
    unique_ptr<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>,_std::default_delete<indirect_shared_control_block<BaseType,_DerivedType,_default_copy<DerivedType>,_default_delete<DerivedType>_>_>_>
    ::~unique_ptr(local_38);
    this->ptr_ = local_20;
  }
  return;
}

Assistant:

explicit copy_on_write(U* u, C copier = C{}, D deleter = D{})
  {
    if (!u)
    {
      return;
    }

    assert(typeid(*u) == typeid(U));

    cb_ = std::make_unique<indirect_shared_control_block<T, U, C, D>>(
        u, std::move(copier), std::move(deleter));
    ptr_ = u;
  }